

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void xm_note_off(DUMB_IT_SIGDATA *sigdata,IT_CHANNEL *channel)

{
  long in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RSI + 0x88) != 0) {
    if (((*(char *)(in_RSI + 0xe) == '\0') ||
        (*(int *)(in_RDI + 0x54) < (int)(uint)*(byte *)(in_RSI + 0xe))) ||
       ((*(byte *)(*(long *)(in_RDI + 0x110) + (long)(int)(*(byte *)(in_RSI + 0xe) - 1) * 0x29c +
                  0x30) & 1) == 0)) {
      *(undefined1 *)(in_RSI + 4) = 0;
    }
    **(uint **)(in_RSI + 0x88) = **(uint **)(in_RSI + 0x88) | 6;
    it_playing_update_resamplers(*(IT_PLAYING **)(in_RSI + 0x88));
  }
  return;
}

Assistant:

static void xm_note_off(DUMB_IT_SIGDATA *sigdata, IT_CHANNEL *channel)
{
	if (channel->playing) {
		if (!channel->instrument || channel->instrument > sigdata->n_instruments ||
			!(sigdata->instrument[channel->instrument-1].volume_envelope.flags & IT_ENVELOPE_ON))
			//if (!(entry->mask & IT_ENTRY_INSTRUMENT))
			// dunno what that was there for ...
				channel->volume = 0;
		channel->playing->flags |= IT_PLAYING_SUSTAINOFF | IT_PLAYING_FADING;
		it_playing_update_resamplers(channel->playing);
	}
}